

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O1

Result __thiscall
wabt::LexerSourceLineFinder::GetSourceLine
          (LexerSourceLineFinder *this,Location *loc,Offset max_line_length,
          SourceLine *out_source_line)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  undefined1 auVar2 [8];
  unsigned_long uVar3;
  Result RVar4;
  int iVar5;
  LexerSourceLineFinder *pLVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  pointer pcVar9;
  Offset in_R8;
  Enum EVar10;
  OffsetRange OVar11;
  undefined1 auStack_78 [8];
  OffsetRange original;
  vector<char,_std::allocator<char>_> read_line;
  
  uVar7 = *(unsigned_long *)((long)&(loc->field_1).field_1.offset + 4);
  auStack_78 = (undefined1  [8])0x0;
  original.start = 0;
  RVar4 = GetLineOffsets(this,(loc->field_1).field_0.line,(OffsetRange *)auStack_78);
  uVar3 = original.start;
  auVar2 = auStack_78;
  EVar10 = Error;
  if (RVar4.enum_ != Error) {
    OVar11.end = uVar7;
    OVar11.start = original.start;
    OVar11 = ClampSourceLineOffsets
                       ((LexerSourceLineFinder *)auStack_78,OVar11,(ColumnRange)max_line_length,
                        in_R8);
    uVar7 = OVar11.end;
    pLVar6 = (LexerSourceLineFinder *)OVar11.start;
    out_source_line->column_offset = (int)OVar11.start - auVar2._0_4_;
    if ((undefined1  [8])pLVar6 != auVar2) {
      std::__cxx11::string::append((string *)out_source_line,"...");
      pLVar6 = (LexerSourceLineFinder *)
               ((long)&(pLVar6->source_)._M_t.
                       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                       .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + 3);
    }
    uVar8 = uVar7 - 3;
    if (uVar3 == uVar7) {
      uVar8 = uVar7;
    }
    original.end = 0;
    _Var1._M_head_impl =
         (this->source_)._M_t.
         super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
         super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
         super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
    iVar5 = (*(_Var1._M_head_impl)->_vptr_LexerSource[5])(_Var1._M_head_impl,pLVar6,uVar8);
    EVar10 = Error;
    if (iVar5 != 1) {
      pcVar9 = (out_source_line->line)._M_dataplus._M_p + (out_source_line->line)._M_string_length;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)out_source_line,pcVar9,pcVar9,original.end,0);
      EVar10 = Ok;
      if (uVar3 != uVar7) {
        std::__cxx11::string::append((string *)out_source_line,"...");
        EVar10 = Ok;
      }
    }
    if (original.end != 0) {
      operator_delete((void *)original.end);
    }
  }
  return (Result)EVar10;
}

Assistant:

Result LexerSourceLineFinder::GetSourceLine(const Location& loc,
                                            Offset max_line_length,
                                            SourceLine* out_source_line) {
  ColumnRange column_range(loc.first_column, loc.last_column);
  OffsetRange original;
  CHECK_RESULT(GetLineOffsets(loc.line, &original));

  OffsetRange clamped =
      ClampSourceLineOffsets(original, column_range, max_line_length);
  bool has_start_ellipsis = original.start != clamped.start;
  bool has_end_ellipsis = original.end != clamped.end;

  out_source_line->column_offset = clamped.start - original.start;

  if (has_start_ellipsis) {
    out_source_line->line += "...";
    clamped.start += 3;
  }
  if (has_end_ellipsis) {
    clamped.end -= 3;
  }

  std::vector<char> read_line;
  CHECK_RESULT(source_->ReadRange(clamped, &read_line));
  out_source_line->line.append(read_line.begin(), read_line.end());

  if (has_end_ellipsis) {
    out_source_line->line += "...";
  }

  return Result::Ok;
}